

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_four.h
# Opt level: O0

void __thiscall ConnectFourState::print(ConnectFourState *this,ostream *out)

{
  ostream *poVar1;
  void *pvVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  ostream *in_RSI;
  int *in_RDI;
  int col_2;
  int col_1;
  int row;
  int col;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  std::operator<<(in_RSI," ");
  for (local_14 = 0; local_14 < in_RDI[2] + -1; local_14 = local_14 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(in_RSI,local_14);
    std::operator<<(poVar1,' ');
  }
  pvVar2 = (void *)std::ostream::operator<<(in_RSI,in_RDI[2] + -1);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  for (local_18 = 0; local_18 < in_RDI[1]; local_18 = local_18 + 1) {
    std::operator<<(in_RSI,"|");
    for (local_1c = 0; local_1c < in_RDI[2] + -1; local_1c = local_1c + 1) {
      pvVar3 = std::
               vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                             *)(in_RDI + 4),(long)local_18);
      pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](pvVar3,(long)local_1c);
      poVar1 = std::operator<<(in_RSI,*pvVar4);
      std::operator<<(poVar1,' ');
    }
    pvVar3 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                           *)(in_RDI + 4),(long)local_18);
    pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](pvVar3,(long)(in_RDI[2] + -1));
    poVar1 = std::operator<<(in_RSI,*pvVar4);
    poVar1 = std::operator<<(poVar1,"|");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<(in_RSI,"+");
  for (local_20 = 0; local_20 < in_RDI[2] + -1; local_20 = local_20 + 1) {
    std::operator<<(in_RSI,"--");
  }
  poVar1 = std::operator<<(in_RSI,"-+");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,".XO"[*in_RDI]);
  poVar1 = std::operator<<(poVar1," to move ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print(ostream& out) const
	{
		out << endl;
		out << " ";
		for (int col = 0; col < num_cols - 1; ++col) {
			out << col << ' ';
		}
		out << num_cols - 1 << endl;
		for (int row = 0; row < num_rows; ++row) {
			out << "|";
			for (int col = 0; col < num_cols - 1; ++col) {
				out << board[row][col] << ' ';
			}
			out << board[row][num_cols - 1] << "|" << endl;
		}
		out << "+";
		for (int col = 0; col < num_cols - 1; ++col) {
			out << "--";
		}
		out << "-+" << endl;
		out << player_markers[player_to_move] << " to move " << endl << endl;
	}